

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commit.cpp
# Opt level: O0

void commit(int argc,char **argv)

{
  size_type sVar1;
  char *pcVar2;
  EVP_PKEY_CTX *dst;
  EVP_PKEY_CTX *src;
  FILE *pFVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  FILE *file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0 [8];
  string source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [8];
  string dest;
  int local_25c;
  undefined1 local_258 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [8];
  string destination_dir;
  string local_200 [32];
  string local_1e0 [8];
  string new_hash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [8];
  string seed;
  string local_120 [8];
  string old_hash;
  string local_100 [8];
  string time;
  undefined1 local_e0 [8];
  GlobalConfig globalConfig;
  undefined1 local_88 [8];
  string str;
  allocator local_61;
  string local_60 [8];
  string msg;
  undefined1 local_30 [8];
  vector<FileStatus,_std::allocator<FileStatus>_> status;
  char **argv_local;
  int argc_local;
  
  status.super__Vector_base<FileStatus,_std::allocator<FileStatus>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)argv;
  stageStatus();
  sVar1 = std::vector<FileStatus,_std::allocator<FileStatus>_>::size
                    ((vector<FileStatus,_std::allocator<FileStatus>_> *)local_30);
  if (sVar1 == 0) {
    printf("Nothing to commit\n");
    exit(0);
  }
  if (argc < 1) {
    printf("Need commit msg\n");
    exit(1);
  }
  pcVar2 = *(char **)status.super__Vector_base<FileStatus,_std::allocator<FileStatus>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,pcVar2,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::vector<FileStatus,_std::allocator<FileStatus>_>::vector
            ((vector<FileStatus,_std::allocator<FileStatus>_> *)&globalConfig.field_0x38,
             (vector<FileStatus,_std::allocator<FileStatus>_> *)local_30);
  strStatus_abi_cxx11_((vector<FileStatus,_std::allocator<FileStatus>_> *)local_88);
  std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector
            ((vector<FileStatus,_std::allocator<FileStatus>_> *)&globalConfig.field_0x38);
  getGlobalConfig();
  getTime_abi_cxx11_();
  last_commit_hash_abi_cxx11_();
  std::operator+(local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::operator+(local_1a0,local_1c0);
  std::operator+(local_180,local_1a0);
  std::operator+(local_160,local_180);
  std::operator+(local_140,local_160);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::string(local_200,(string *)local_140);
  hash(local_1e0);
  std::__cxx11::string::~string(local_200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,COMMITS_DIR_abi_cxx11_);
  std::operator+(local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  mkdir(pcVar2,0x1ff);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  ls_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258,pcVar2);
  local_25c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_258);
    if (sVar1 <= (ulong)(long)local_25c) break;
    std::operator+(local_2a0,(char *)local_220);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_258,(long)local_25c);
    std::operator+(local_280,local_2a0);
    std::__cxx11::string::~string((string *)local_2a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                   STAGE_DIR_abi_cxx11_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_258,(long)local_25c);
    std::operator+(local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
    std::__cxx11::string::~string((string *)&file);
    dst = (EVP_PKEY_CTX *)std::__cxx11::string::c_str();
    src = (EVP_PKEY_CTX *)std::__cxx11::string::c_str();
    copy(dst,src);
    std::__cxx11::string::~string((string *)local_2c0);
    std::__cxx11::string::~string((string *)local_280);
    local_25c = local_25c + 1;
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(pcVar2,"a");
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar3,"%s\n",uVar4);
  fclose(pFVar3);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(pcVar2,"a");
  fprintf(pFVar3,"------------\n");
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar3,"Hash: %s\n",uVar4);
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar3,"Msg: %s\n",uVar4);
  uVar4 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::c_str();
  fprintf(pFVar3,"Create by name:%s email:%s\n",uVar4,uVar5);
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar3,"On:%s\n\n",uVar4);
  fclose(pFVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_258);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_100);
  GlobalConfig::~GlobalConfig((GlobalConfig *)local_e0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_60);
  std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector
            ((vector<FileStatus,_std::allocator<FileStatus>_> *)local_30);
  return;
}

Assistant:

void commit(int argc, char *argv[]){
    Vector<FileStatus> status = stageStatus();
    if(status.size()==0){
        printf("Nothing to commit\n");
        exit(EXIT_SUCCESS);
    }
    if(argc <1){
        printf("Need commit msg\n");
        exit(EXIT_FAILURE);
    }
    String msg = argv[0];
    String str = strStatus(status);
    GlobalConfig globalConfig = getGlobalConfig();
    String time = getTime();
    String old_hash = last_commit_hash();
    String seed = msg + str + globalConfig.name + globalConfig.email + time + old_hash;
    String new_hash = hash(seed);
    String destination_dir = COMMITS_DIR + "/" + new_hash;

    mkdir(destination_dir.c_str(),DEFAULT_PERM);
    Vector<String> files = ls(STAGE_DIR.c_str());
    for(int i = 0; i < files.size();i++){
        String dest = destination_dir + "/" + files[i];
        String source = STAGE_DIR + "/" + files[i];
        copy(source.c_str(),dest.c_str());
    }
    FILE * file = fopen(HEAD.c_str(),"a");
    fprintf(file,"%s\n",new_hash.c_str());
    fclose(file);
    file = fopen(LOG.c_str(),"a");

    fprintf(file,"------------\n");
    fprintf(file,"Hash: %s\n",new_hash.c_str());
    fprintf(file,"Msg: %s\n",msg.c_str());
    fprintf(file,"Create by name:%s email:%s\n",globalConfig.name.c_str(),globalConfig.email.c_str());
    fprintf(file,"On:%s\n\n",time.c_str());
    fclose(file);
}